

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastener::IfcMechanicalFastener(IfcMechanicalFastener *this)

{
  *(undefined ***)&this->field_0x188 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x190 = 0;
  *(char **)&this->field_0x198 = "IfcMechanicalFastener";
  IfcFastener::IfcFastener(&this->super_IfcFastener,&PTR_construction_vtable_24__0086ad38);
  *(undefined8 *)&(this->super_IfcFastener).field_0x160 = 0;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject = 0x86abe0;
  *(undefined8 *)&this->field_0x188 = 0x86ad20;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0x88 = 0x86ac08;
  (this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
  super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x86ac30;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0xd0 = 0x86ac58;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    field_0x100 = 0x86ac80;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.field_0x138 =
       0x86aca8;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.field_0x148 =
       0x86acd0;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.field_0x158 = 0x86acf8;
  this->field_0x170 = 0;
  (this->NominalLength).have = false;
  return;
}

Assistant:

IfcMechanicalFastener() : Object("IfcMechanicalFastener") {}